

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O3

bool __thiscall
Diligent::PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
          (PipelineResourceSignatureGLImpl *this,GLResourceAttribs *GLAttribs,
          RESOURCE_DIMENSION ResourceDim,bool IsMultisample,Uint32 ResIndex,
          ShaderResourceCacheGL *ResourceCache,char *ShaderName,char *PSOName)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  BINDING_RANGE BVar5;
  uint uVar6;
  Uint32 UVar7;
  undefined7 uVar14;
  CachedUB *pCVar8;
  CachedResourceView *pCVar9;
  ITextureView *pIVar10;
  IBufferView *pIVar11;
  CachedSSBO *pCVar12;
  BufferGLImpl *pBVar13;
  undefined7 in_register_00000009;
  char (*Args_1) [41];
  char (*Args_1_00) [41];
  PipelineResourceDesc *pPVar15;
  uint CacheOffset;
  Uint32 ArrayIndex;
  char (*Args_2) [14];
  Uint32 UVar16;
  ResourceAttribs *Res;
  undefined4 uVar17;
  string msg;
  String local_58;
  PipelineResourceDesc *local_38;
  
  Args_2 = (char (*) [14])(ulong)ResIndex;
  Args_1 = (char (*) [41])CONCAT71(in_register_00000009,IsMultisample);
  Args_1_00 = Args_1;
  if ((this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources <= ResIndex) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ResIndex < m_Desc.NumResources",(char (*) [31])Args_1);
    Args_1_00 = (char (*) [41])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  uVar6 = (uint)Args_1;
  pPVar15 = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
            .m_Desc.Resources;
  Res = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).m_pResourceAttribs
        + ResIndex;
  iVar4 = strcmp(pPVar15[ResIndex].Name,GLAttribs->Name);
  if (iVar4 != 0) {
    FormatString<char[28]>(&msg,(char (*) [28])"Inconsistent resource names");
    Args_1_00 = (char (*) [41])0x224;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
               ,0x224);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar15 = pPVar15 + ResIndex;
  if (pPVar15->ResourceType == SHADER_RESOURCE_TYPE_SAMPLER) {
    uVar17 = 1;
  }
  else {
    if (pPVar15->ArraySize < GLAttribs->ArraySize) {
      FormatString<char[26],char[41]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GLAttribs.ArraySize <= ResDesc.ArraySize",Args_1_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    BVar5 = PipelineResourceToBindingRange(pPVar15);
    uVar17 = 1;
    uVar14 = (undefined7)
             ((ulong)((long)&switchD_00170365::switchdataD_00338ed0 +
                     (long)(int)(&switchD_00170365::switchdataD_00338ed0)[BVar5]) >> 8);
    local_38 = pPVar15;
    switch(BVar5) {
    case BINDING_RANGE_UNIFORM_BUFFER:
      uVar1 = GLAttribs->ArraySize;
      if (uVar1 != 0) {
        UVar16 = 0;
        uVar17 = (undefined4)CONCAT71(uVar14,1);
        do {
          ArrayIndex = (Uint32)Args_2;
          UVar7 = Res->CacheOffset + UVar16;
          if (UVar7 < ResourceCache->m_TexturesOffset / 0x18) {
            pCVar8 = ShaderResourceCacheGL::GetConstUB(ResourceCache,UVar7);
            ArrayIndex = (Uint32)Args_2;
            if ((pCVar8->pBuffer).m_pObject == (BufferGLImpl *)0x0) {
              uVar1 = GLAttribs->ArraySize;
              goto LAB_001703c3;
            }
          }
          else {
LAB_001703c3:
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_58,(Diligent *)GLAttribs->Name,(char *)(ulong)uVar1,UVar16,ArrayIndex)
            ;
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x32e724,(char (*) [2])CONCAT44(uVar6,uVar17));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            uVar17 = 0;
          }
          UVar16 = UVar16 + 1;
          uVar1 = GLAttribs->ArraySize;
        } while (UVar16 < uVar1);
      }
      break;
    case BINDING_RANGE_TEXTURE:
      if (GLAttribs->ArraySize != 0) {
        UVar16 = 0;
        uVar17 = (undefined4)CONCAT71(uVar14,1);
        uVar6 = uVar6 & 0xff;
        do {
          UVar7 = (Uint32)Args_2;
          bVar3 = ShaderResourceCacheGL::IsTextureBound
                            (ResourceCache,Res->CacheOffset + UVar16,
                             pPVar15->ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT ||
                             pPVar15->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV);
          if (bVar3) {
            pCVar9 = ShaderResourceCacheGL::GetConstTexture(ResourceCache,Res->CacheOffset + UVar16)
            ;
            pcVar2 = GLAttribs->Name;
            UVar7 = GLAttribs->ArraySize;
            if (pCVar9->pTexture == (TextureBaseGL *)0x0) {
              pIVar11 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                  (&pCVar9->pView);
              Args_2 = (char (*) [14])(ulong)(uint)ResourceDim;
              ValidateResourceViewDimension<Diligent::IBufferView>
                        (pcVar2,UVar7,UVar16,pIVar11,ResourceDim,SUB41(uVar6,0));
            }
            else {
              pIVar10 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                  (&pCVar9->pView);
              Args_2 = (char (*) [14])(ulong)(uint)ResourceDim;
              ValidateResourceViewDimension<Diligent::ITextureView>
                        (pcVar2,UVar7,UVar16,pIVar10,ResourceDim,SUB41(uVar6,0));
            }
            UVar7 = GetImmutableSamplerIdx(this,Res);
            pPVar15 = local_38;
            if (UVar7 != 0xffffffff) {
              pBVar13 = (pCVar9->field_2).pBuffer;
              if (pBVar13 == (BufferGLImpl *)0x0) {
                FormatString<char[66]>
                          (&msg,(char (*) [66])
                                "Immutable sampler is not initialized in the cache - this is a bug")
                ;
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                           ,0x25d);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
                pBVar13 = (pCVar9->field_2).pBuffer;
              }
              pPVar15 = local_38;
              if (pBVar13 !=
                  (BufferGLImpl *)
                  (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                  m_pImmutableSamplers[UVar7].m_pObject) {
                FormatString<char[56]>
                          (&msg,(char (*) [56])
                                "Immutable sampler initialized in the cache is not valid");
                DebugAssertionFailed
                          (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                           ,0x25e);
                pPVar15 = local_38;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)msg._M_dataplus._M_p != &msg.field_2) {
                  operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          else {
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_58,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar16,UVar7);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x32e724,(char (*) [2])CONCAT44(uVar6,uVar17));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            uVar17 = 0;
          }
          UVar16 = UVar16 + 1;
        } while (UVar16 < GLAttribs->ArraySize);
      }
      break;
    case BINDING_RANGE_IMAGE:
      if (GLAttribs->ArraySize != 0) {
        uVar17 = (undefined4)CONCAT71(uVar14,1);
        UVar16 = 0;
        uVar6 = uVar6 & 0xff;
        do {
          UVar7 = (Uint32)Args_2;
          bVar3 = ShaderResourceCacheGL::IsImageBound
                            (ResourceCache,Res->CacheOffset + UVar16,
                             (pPVar15->ResourceType - SHADER_RESOURCE_TYPE_TEXTURE_SRV & 0xfd) == 0)
          ;
          if (bVar3) {
            pCVar9 = ShaderResourceCacheGL::GetConstImage(ResourceCache,Res->CacheOffset + UVar16);
            pcVar2 = GLAttribs->Name;
            UVar7 = GLAttribs->ArraySize;
            if (pCVar9->pTexture == (TextureBaseGL *)0x0) {
              pIVar11 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::IBufferView>
                                  (&pCVar9->pView);
              Args_2 = (char (*) [14])(ulong)ResourceDim;
              ValidateResourceViewDimension<Diligent::IBufferView>
                        (pcVar2,UVar7,UVar16,pIVar11,ResourceDim,SUB41(uVar6,0));
              pPVar15 = local_38;
            }
            else {
              pIVar10 = RefCntAutoPtr<Diligent::IDeviceObject>::RawPtr<Diligent::ITextureView>
                                  (&pCVar9->pView);
              Args_2 = (char (*) [14])(ulong)ResourceDim;
              ValidateResourceViewDimension<Diligent::ITextureView>
                        (pcVar2,UVar7,UVar16,pIVar10,ResourceDim,SUB41(uVar6,0));
              pPVar15 = local_38;
            }
          }
          else {
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_58,(Diligent *)GLAttribs->Name,(char *)(ulong)GLAttribs->ArraySize,
                       UVar16,UVar7);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x32e724,(char (*) [2])CONCAT44(uVar6,uVar17));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            uVar17 = 0;
          }
          UVar16 = UVar16 + 1;
        } while (UVar16 < GLAttribs->ArraySize);
      }
      break;
    case BINDING_RANGE_STORAGE_BUFFER:
      uVar1 = GLAttribs->ArraySize;
      uVar17 = 1;
      if (uVar1 != 0) {
        UVar16 = 0;
        uVar17 = (undefined4)CONCAT71(uVar14,1);
        do {
          UVar7 = (Uint32)Args_2;
          CacheOffset = Res->CacheOffset + UVar16;
          if (CacheOffset <
              (uint)((ulong)ResourceCache->m_MemoryEndOffset - (ulong)ResourceCache->m_SSBOsOffset
                    >> 4)) {
            pCVar12 = ShaderResourceCacheGL::GetConstSSBO(ResourceCache,CacheOffset);
            UVar7 = (Uint32)Args_2;
            if ((pCVar12->pBufferView).m_pObject == (BufferViewGLImpl *)0x0) {
              uVar1 = GLAttribs->ArraySize;
              goto LAB_00170657;
            }
          }
          else {
LAB_00170657:
            GetShaderResourcePrintName_abi_cxx11_
                      (&local_58,(Diligent *)GLAttribs->Name,(char *)(ulong)uVar1,UVar16,UVar7);
            Args_2 = (char (*) [14])&ShaderName;
            FormatString<char[35],std::__cxx11::string,char[14],char_const*,char[11],char_const*,char[2]>
                      (&msg,(Diligent *)"No resource is bound to variable \'",
                       (char (*) [35])&local_58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\' in shader \'",Args_2,(char **)"\' of PSO \'",(char (*) [11])&PSOName,
                       (char **)0x32e724,(char (*) [2])CONCAT44(uVar6,uVar17));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char (*) [14])0x0;
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
            uVar17 = 0;
          }
          UVar16 = UVar16 + 1;
          uVar1 = GLAttribs->ArraySize;
        } while (UVar16 < uVar1);
      }
      break;
    default:
      FormatString<char[40]>(&msg,(char (*) [40])"Unsupported shader resource range type.");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"DvpValidateCommittedResource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                 ,0x278);
      uVar17 = 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (bool)((byte)uVar17 & 1);
}

Assistant:

bool PipelineResourceSignatureGLImpl::DvpValidateCommittedResource(const ShaderResourcesGL::GLResourceAttribs& GLAttribs,
                                                                   RESOURCE_DIMENSION                          ResourceDim,
                                                                   bool                                        IsMultisample,
                                                                   Uint32                                      ResIndex,
                                                                   const ShaderResourceCacheGL&                ResourceCache,
                                                                   const char*                                 ShaderName,
                                                                   const char*                                 PSOName) const
{
    VERIFY_EXPR(ResIndex < m_Desc.NumResources);
    const auto& ResDesc = m_Desc.Resources[ResIndex];
    const auto& ResAttr = m_pResourceAttribs[ResIndex];
    VERIFY(strcmp(ResDesc.Name, GLAttribs.Name) == 0, "Inconsistent resource names");

    if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER)
        return true; // Skip separate samplers

    VERIFY_EXPR(GLAttribs.ArraySize <= ResDesc.ArraySize);

    bool BindingsOK = true;

    static_assert(BINDING_RANGE_COUNT == 4, "Please update the switch below to handle the new shader resource range");
    switch (PipelineResourceToBindingRange(ResDesc))
    {
        case BINDING_RANGE_UNIFORM_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsUBBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_STORAGE_BUFFER:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                if (!ResourceCache.IsSSBOBound(ResAttr.CacheOffset + ArrInd))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                }
            }
            break;

        case BINDING_RANGE_TEXTURE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
                if (!ResourceCache.IsTextureBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Tex = ResourceCache.GetConstTexture(ResAttr.CacheOffset + ArrInd);
                if (Tex.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Tex.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);

                const auto ImmutableSamplerIdx = GetImmutableSamplerIdx(ResAttr);
                if (ImmutableSamplerIdx != InvalidImmutableSamplerIndex)
                {
                    VERIFY(Tex.pSampler != nullptr, "Immutable sampler is not initialized in the cache - this is a bug");
                    VERIFY(Tex.pSampler == m_pImmutableSamplers[ImmutableSamplerIdx], "Immutable sampler initialized in the cache is not valid");
                }
            }
            break;

        case BINDING_RANGE_IMAGE:
            for (Uint32 ArrInd = 0; ArrInd < GLAttribs.ArraySize; ++ArrInd)
            {
                const bool IsTexView = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV || ResDesc.ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_UAV);
                if (!ResourceCache.IsImageBound(ResAttr.CacheOffset + ArrInd, IsTexView))
                {
                    LOG_ERROR_MESSAGE("No resource is bound to variable '", GetShaderResourcePrintName(GLAttribs, ArrInd),
                                      "' in shader '", ShaderName, "' of PSO '", PSOName, "'");
                    BindingsOK = false;
                    continue;
                }

                const auto& Img = ResourceCache.GetConstImage(ResAttr.CacheOffset + ArrInd);
                if (Img.pTexture)
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<ITextureView>(), ResourceDim, IsMultisample);
                else
                    ValidateResourceViewDimension(GLAttribs.Name, GLAttribs.ArraySize, ArrInd, Img.pView.RawPtr<IBufferView>(), ResourceDim, IsMultisample);
            }
            break;

        default:
            UNEXPECTED("Unsupported shader resource range type.");
    }

    return BindingsOK;
}